

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHandTrackerDevice.cpp
# Opt level: O0

void __thiscall
MinVR::VRFakeHandTrackerDevice::onVREvent(VRFakeHandTrackerDevice *this,VRDataIndex *event)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  VRAnyCoreType VVar6;
  size_type sVar7;
  reference pvVar8;
  VRDataIndex *this_00;
  long in_RDI;
  VRDataIndex di;
  VRMatrix4 xform;
  VRVector3 pos;
  float deltaY;
  float deltaX;
  float mousey;
  float mousex;
  VRFloatArray screenPos;
  VRDataIndex *in_stack_fffffffffffffa08;
  VRMatrix4 *in_stack_fffffffffffffa10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa20;
  VRVector3 *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  VRMatrix4 *this_02;
  undefined6 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa46;
  undefined1 in_stack_fffffffffffffa47;
  char *in_stack_fffffffffffffa48;
  char *__s;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa58;
  VRVector3 *v;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  VRDataIndex *event_00;
  undefined7 in_stack_fffffffffffffa70;
  VRMatrix4 *m1;
  undefined7 in_stack_fffffffffffffa88;
  VRDataIndex *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  VRMatrix4 local_428;
  undefined1 in_stack_fffffffffffffc67;
  VRFloatArrayConvertible in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  VRDataIndex *in_stack_fffffffffffffc78;
  VRMatrix4 local_380;
  VRMatrix4 local_338;
  VRMatrix4 local_2f0;
  VRMatrix4 local_2a8;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  undefined1 local_249 [40];
  allocator<char> local_221;
  string local_220 [32];
  VRDatum_conflict *local_200;
  vector<float,_std::allocator<float>_> local_1f8;
  undefined1 local_1e0 [40];
  string local_1b8 [56];
  string local_180 [39];
  undefined1 local_159 [57];
  string local_120 [39];
  undefined1 local_f9 [57];
  string local_c0 [39];
  undefined1 local_99 [73];
  string local_50 [32];
  string local_30 [48];
  
  VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffa08);
  bVar1 = std::operator==(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  std::__cxx11::string::~string(local_30);
  if ((bVar1 & 1) == 0) {
    VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffa08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58);
    m1 = (VRMatrix4 *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
               in_stack_fffffffffffffa48,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffa47,
                        CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
    bVar2 = eventMatch(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
                      );
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffa20);
    std::__cxx11::string::~string(local_50);
    if ((bVar2 & 1) == 0) {
      VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffa08);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa58);
      event_00 = (VRDataIndex *)local_f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
      bVar3 = eventMatch(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                         in_stack_fffffffffffffa98);
      std::__cxx11::string::~string((string *)(local_f9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffa20);
      std::__cxx11::string::~string(local_c0);
      if ((bVar3 & 1) == 0) {
        VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffa08);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(bVar3,in_stack_fffffffffffffa60),in_stack_fffffffffffffa58);
        v = (VRVector3 *)local_159;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                   in_stack_fffffffffffffa48,
                   (allocator<char> *)
                   CONCAT17(in_stack_fffffffffffffa47,
                            CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
        bVar4 = eventMatch(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                           in_stack_fffffffffffffa98);
        std::__cxx11::string::~string((string *)(local_159 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_159);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffa20);
        std::__cxx11::string::~string(local_120);
        if ((bVar4 & 1) == 0) {
          VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffa08);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(bVar3,in_stack_fffffffffffffa60),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)v);
          __s = local_1e0 + 0x27;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar4,in_stack_fffffffffffffa50),__s,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffa47,
                              CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
          bVar3 = eventMatch(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                             in_stack_fffffffffffffa98);
          std::__cxx11::string::~string(local_1b8);
          std::allocator<char>::~allocator((allocator<char> *)(local_1e0 + 0x27));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(in_stack_fffffffffffffa20);
          std::__cxx11::string::~string(local_180);
          if ((bVar3 & 1) == 0) {
            this_02 = (VRMatrix4 *)local_1e0;
            VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffa08);
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08);
            std::__cxx11::string::~string((string *)local_1e0);
            if ((bVar5 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar4,in_stack_fffffffffffffa50),__s,
                         (allocator<char> *)
                         CONCAT17(bVar3,CONCAT16(bVar5,in_stack_fffffffffffffa40)));
              this_01 = (VRVector3 *)local_249;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar4,in_stack_fffffffffffffa50),__s,
                         (allocator<char> *)
                         CONCAT17(bVar3,CONCAT16(bVar5,in_stack_fffffffffffffa40)));
              VVar6 = VRDataIndex::getValue
                                (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                                 (string *)in_stack_fffffffffffffc68._vptr_VRFloatArrayConvertible,
                                 (bool)in_stack_fffffffffffffc67);
              local_200 = VVar6.datum;
              VRDatumConverter::operator_cast_to_vector
                        ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffffa08);
              std::__cxx11::string::~string((string *)(local_249 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_249);
              std::__cxx11::string::~string(local_220);
              std::allocator<char>::~allocator(&local_221);
              sVar7 = std::vector<float,_std::allocator<float>_>::size(&local_1f8);
              if (1 < sVar7) {
                pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,0);
                local_250 = (*pvVar8 - 0.5) * 2.0;
                pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,1);
                local_254 = ((1.0 - *pvVar8) - 0.5) * 2.0;
                if ((*(byte *)(in_RDI + 0x94) & 1) != 0) {
                  local_258 = local_250 - *(float *)(in_RDI + 0xe8);
                  local_25c = local_254 - *(float *)(in_RDI + 0xec);
                  if (*(int *)(in_RDI + 0x90) == 1) {
                    *(float *)(in_RDI + 0x98) =
                         *(float *)(in_RDI + 0x54) * local_25c + *(float *)(in_RDI + 0x98);
                  }
                  else if (*(int *)(in_RDI + 0x90) == 2) {
                    VRMatrix4::rotationY((float)((ulong)v >> 0x20));
                    VRMatrix4::rotationX((float)((ulong)v >> 0x20));
                    MinVR::operator*(m1,(VRMatrix4 *)CONCAT17(bVar2,in_stack_fffffffffffffa70));
                    MinVR::operator*(m1,(VRMatrix4 *)CONCAT17(bVar2,in_stack_fffffffffffffa70));
                    VRMatrix4::operator=
                              (in_stack_fffffffffffffa10,(VRMatrix4 *)in_stack_fffffffffffffa08);
                    VRMatrix4::~VRMatrix4(&local_2a8);
                    VRMatrix4::~VRMatrix4(&local_2f0);
                    VRMatrix4::~VRMatrix4(&local_380);
                    VRMatrix4::~VRMatrix4(&local_338);
                  }
                  VRVector3::VRVector3
                            (this_01,(float)((ulong)VVar6.datum >> 0x20),SUB84(VVar6.datum,0),
                             (float)((ulong)in_stack_fffffffffffffa10 >> 0x20));
                  VRMatrix4::translation(v);
                  MinVR::operator*(m1,(VRMatrix4 *)CONCAT17(bVar2,in_stack_fffffffffffffa70));
                  VRMatrix4::~VRMatrix4(&local_428);
                  this_00 = (VRDataIndex *)(in_RDI + 0x10);
                  VRMatrix4::toVRFloatArray(this_02);
                  VRTrackerEvent::createValidDataIndex
                            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
                  std::vector<float,_std::allocator<float>_>::~vector
                            ((vector<float,_std::allocator<float>_> *)this_01);
                  VRDataIndex::VRDataIndex
                            (in_stack_fffffffffffffa90,
                             (VRDataIndex *)CONCAT17(bVar1,in_stack_fffffffffffffa88));
                  VRDataQueue::push((VRDataQueue *)CONCAT17(bVar2,in_stack_fffffffffffffa70),
                                    event_00);
                  VRDataIndex::~VRDataIndex(this_00);
                  VRDataIndex::~VRDataIndex(this_00);
                  VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffc20);
                  VRVector3::~VRVector3((VRVector3 *)&stack0xfffffffffffffc68);
                }
                *(float *)(in_RDI + 0xe8) = local_250;
                *(float *)(in_RDI + 0xec) = local_254;
              }
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)this_01);
            }
          }
          else {
            *(undefined4 *)(in_RDI + 0x90) = 0;
          }
        }
        else {
          *(undefined4 *)(in_RDI + 0x90) = 2;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x90) = 0;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x90) = 1;
    }
  }
  else {
    *(byte *)(in_RDI + 0x94) = (*(byte *)(in_RDI + 0x94) ^ 0xff) & 1;
    if ((*(byte *)(in_RDI + 0x94) & 1) != 0) {
      *(undefined4 *)(in_RDI + 0x90) = 0;
    }
  }
  return;
}

Assistant:

void VRFakeHandTrackerDevice::onVREvent(const VRDataIndex &event)
{
    if (event.getName() == _toggleEvent) {
        _tracking = !_tracking;
        if (_tracking) {
            _state = VRFakeHandTrackerDevice::XYTranslating;
        }
    }
    else if (eventMatch(event.getName(), _zKeys, "Down")) {
        _state = VRFakeHandTrackerDevice::ZTranslating;
    }
    else if (eventMatch(event.getName(), _zKeys, "Up")) {
        _state = VRFakeHandTrackerDevice::XYTranslating;
    }
    else if (eventMatch(event.getName(), _rotKeys, "Down")) {
        _state = VRFakeHandTrackerDevice::Rotating;
    }
    else if (eventMatch(event.getName(), _rotKeys, "Up")) {
        _state = VRFakeHandTrackerDevice::XYTranslating;
    }
    else if (event.getName() == "Mouse_Move") {
        VRFloatArray screenPos = event.getValue("NormalizedPosition");
        if (screenPos.size() >= 2) {
            float mousex = 2.0f*(screenPos[0] - 0.5f);
            float mousey = 2.0f*((1.0f-screenPos[1]) - 0.5f);

            if (_tracking) {
                float deltaX = mousex - _lastMouseX;
                float deltaY = mousey - _lastMouseY;
            
                if (_state == VRFakeHandTrackerDevice::ZTranslating) {
                    _z += _zScale * deltaY;
                }
                else if (_state == VRFakeHandTrackerDevice::Rotating) {
                    _R = VRMatrix4::rotationY(_rScale*deltaX) * VRMatrix4::rotationX(-_rScale*deltaY) * _R;
                }
            
                VRVector3 pos = VRVector3(_xyScale * mousex, _xyScale * mousey, _z);
                VRMatrix4 xform  = VRMatrix4::translation(pos) * _R;

                VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, xform.toVRFloatArray());
                _pendingEvents.push(di);
            }
            
            _lastMouseX = mousex;
            _lastMouseY = mousey;
        }
    }
}